

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O3

void __thiscall
optimization::common_expr_del::BlockNodes::add_var(BlockNodes *this,VarId *var,NodeId nodeId)

{
  long *plVar1;
  uint uVar2;
  element_type *peVar3;
  element_type *peVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  _List_node_base *p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  long lVar10;
  bool bVar11;
  
  pmVar5 = std::
           map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
           ::operator[](&this->var_map,var);
  pmVar5->id = nodeId.id;
  uVar2 = var->id;
  peVar3 = (((this->blv->
             super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr)->live_vars_out).
           super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var8 = *(_Base_ptr *)((long)&(peVar3->_M_t)._M_impl.super__Rb_tree_header + 8);
  if (p_Var8 != (_Base_ptr)0x0) {
    p_Var6 = &(peVar3->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var9 = p_Var6;
    do {
      bVar11 = *(uint *)&p_Var8[1]._M_parent < uVar2;
      if (!bVar11) {
        p_Var9 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[bVar11];
    } while (p_Var8 != (_Base_ptr)0x0);
    if ((p_Var9 != p_Var6) && (*(uint *)&p_Var9[1]._M_parent <= uVar2)) {
      lVar10 = 0x58;
      goto LAB_00129e06;
    }
  }
  lVar10 = 0x70;
LAB_00129e06:
  peVar4 = (this->nodes).
           super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start[nodeId.id].
           super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var7 = (_List_node_base *)operator_new(0x20);
  p_Var7[1]._M_next = (_List_node_base *)&PTR_display_001eb100;
  *(uint *)&p_Var7[1]._M_prev = uVar2;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  plVar1 = (long *)((long)&peVar4->operands + lVar10);
  *plVar1 = *plVar1 + 1;
  return;
}

Assistant:

void add_var(mir::inst::VarId var, NodeId nodeId) {
    var_map[var] = nodeId;
    if (in_live_out(var)) {
      nodes[nodeId.id]->add_live_var(var);
    } else {
      nodes[nodeId.id]->add_local_var(var);
    }
  }